

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  int *piVar4;
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  roaring_container_iterator_t *prVar8;
  ushort uVar9;
  int unaff_EBP;
  undefined7 in_register_00000031;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  piVar4 = (int *)c;
  uVar5 = typecode;
  if ((int)CONCAT71(in_register_00000031,typecode) == 4) {
    uVar5 = *(uint8_t *)((long)c + 8);
    piVar4 = *c;
  }
  prVar8 = it;
  if (uVar5 == '\x03') {
    lVar6 = (long)*piVar4;
    if (lVar6 != 0) {
      uVar9 = *(short *)(*(long *)(piVar4 + 2) + -2 + lVar6 * 4) +
              *(short *)(*(long *)(piVar4 + 2) + -4 + lVar6 * 4);
      goto LAB_001114df;
    }
  }
  else if (uVar5 == '\x02') {
    if ((long)*piVar4 != 0) {
      uVar9 = *(ushort *)(*(long *)(piVar4 + 2) + -2 + (long)*piVar4 * 2);
      goto LAB_001114df;
    }
  }
  else {
    uVar7 = 0x400;
    prVar8 = (roaring_container_iterator_t *)CONCAT62((int6)((ulong)it >> 0x10),0xffff);
    do {
      uVar11 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar11;
      uVar2 = *(ulong *)(*(long *)(piVar4 + 2) + uVar7 * 8);
      lVar6 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      if (uVar2 != 0) {
        unaff_EBP = (int)prVar8 - ((uint)lVar6 ^ 0x3f);
      }
      uVar9 = (ushort)unaff_EBP;
      if (uVar2 != 0) goto LAB_001114df;
      prVar8 = (roaring_container_iterator_t *)(ulong)((int)prVar8 - 0x40);
    } while (1 < uVar11);
  }
  uVar9 = 0;
LAB_001114df:
  if (val <= uVar9) {
    if (typecode == '\x03') {
      lVar6 = *(long *)((long)c + 8);
      iVar12 = *c + -1;
      uVar11 = 0;
      do {
        if (iVar12 < (int)uVar11) {
          uVar10 = ~uVar11;
          break;
        }
        uVar10 = uVar11 + iVar12 >> 1;
        uVar1 = *(ushort *)(lVar6 + (ulong)uVar10 * 4);
        if (uVar1 < val) {
          uVar11 = uVar10 + 1;
          bVar3 = true;
        }
        else if (val < uVar1) {
          iVar12 = uVar10 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          prVar8 = (roaring_container_iterator_t *)(ulong)uVar10;
        }
        uVar10 = (uint)prVar8;
      } while (bVar3);
      uVar11 = uVar10;
      if (((int)uVar10 < 0) &&
         ((uVar10 == 0xffffffff ||
          (uVar11 = -uVar10 - 2,
          (int)(uint)*(ushort *)(lVar6 + 2 + (ulong)uVar11 * 4) <
          (int)((uint)val - (uint)*(ushort *)(lVar6 + (ulong)uVar11 * 4)))))) {
        uVar11 = 0xffffffff;
        if ((int)~uVar10 < *c) {
          uVar11 = ~uVar10;
        }
      }
      it->index = uVar11;
      uVar1 = *(ushort *)(lVar6 + (long)(int)uVar11 * 4);
      uVar11 = (uint)uVar1;
      if (uVar1 <= val) {
        uVar11 = (uint)val;
      }
    }
    else if (typecode == '\x02') {
      lVar6 = *(long *)((long)c + 8);
      iVar12 = *c + -1;
      uVar11 = 0;
      do {
        if (iVar12 < (int)uVar11) {
          uVar10 = ~uVar11;
          break;
        }
        uVar10 = uVar11 + iVar12 >> 1;
        uVar1 = *(ushort *)(lVar6 + (ulong)(uVar11 + iVar12 & 0xfffffffe));
        if (uVar1 < val) {
          uVar11 = uVar10 + 1;
          bVar3 = true;
        }
        else if (val < uVar1) {
          iVar12 = uVar10 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          prVar8 = (roaring_container_iterator_t *)(ulong)uVar10;
        }
        uVar10 = (uint)prVar8;
      } while (bVar3);
      uVar11 = 0xffffffff;
      if ((int)~uVar10 < *c) {
        uVar11 = ~uVar10;
      }
      if (-1 < (int)uVar10) {
        uVar11 = uVar10;
      }
      it->index = uVar11;
      uVar11 = (uint)*(ushort *)(lVar6 + (long)(int)uVar11 * 2);
    }
    else {
      uVar11 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
      it->index = uVar11;
    }
    *value_out = (uint16_t)uVar11;
  }
  return val <= uVar9;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}